

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void gl4cts::EnhancedLayouts::Utils::Shader::Compile(Functions *gl,GLuint id)

{
  GLenum GVar1;
  CompilationException *this;
  GLint length;
  GLint status;
  string message;
  GLint local_48;
  GLint local_44;
  GLchar *local_40;
  undefined8 local_38;
  GLchar local_30 [16];
  
  local_44 = 0;
  (*gl->compileShader)(id);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x8f6);
  (*gl->getShaderiv)(id,0x8b81,&local_44);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x8fa);
  if (local_44 == 1) {
    return;
  }
  local_48 = 0;
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = '\0';
  (*gl->getShaderiv)(id,0x8b84,&local_48);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x904);
  std::__cxx11::string::resize((ulong)&local_40,(char)local_48);
  (*gl->getShaderInfoLog)(id,local_48,(GLsizei *)0x0,local_40);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x90b);
  this = (CompilationException *)__cxa_allocate_exception(0x28);
  CompilationException::CompilationException(this,local_40);
  __cxa_throw(this,&CompilationException::typeinfo,CompilationException::~CompilationException);
}

Assistant:

void Shader::Compile(const Functions& gl, GLuint id)
{
	GLint status = GL_FALSE;

	/* Compile */
	gl.compileShader(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

	/* Get compilation status */
	gl.getShaderiv(id, GL_COMPILE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

	/* Log compilation error */
	if (GL_TRUE != status)
	{
		glw::GLint  length = 0;
		std::string message;

		/* Error log length */
		gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length, 0);

		/* Get error log */
		gl.getShaderInfoLog(id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		throw CompilationException(message.c_str());
	}
}